

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

time_t lha_dos_time(uchar *p)

{
  ushort uVar1;
  ushort uVar2;
  time_t tVar3;
  tm local_38;
  
  uVar1 = *(ushort *)p;
  uVar2 = *(ushort *)(p + 2);
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_year = (uVar2 >> 9) + 0x50;
  local_38.tm_mon = (uVar2 >> 5 & 0xf) - 1;
  local_38.tm_mday = uVar2 & 0x1f;
  local_38.tm_hour = (int)(uVar1 >> 0xb);
  local_38.tm_min = uVar1 >> 5 & 0x3f;
  local_38.tm_sec = (uint)uVar1 * 2 & 0x3e;
  local_38.tm_isdst = -1;
  local_38._36_4_ = 0;
  tVar3 = mktime(&local_38);
  return tVar3;
}

Assistant:

static time_t
lha_dos_time(const unsigned char *p)
{
	int msTime, msDate;
	struct tm ts;

	msTime = archive_le16dec(p);
	msDate = archive_le16dec(p+2);

	memset(&ts, 0, sizeof(ts));
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80;   /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1;     /* Month number.     */
	ts.tm_mday = msDate & 0x1f;		    /* Day of month.     */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return (mktime(&ts));
}